

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O2

int wb_write_padding_to_temp(archive_write *a,int64_t csize)

{
  int iVar1;
  
  if (csize % 0x800 != 0) {
    iVar1 = write_null(a,0x800 - csize % 0x800);
    return iVar1;
  }
  return 0;
}

Assistant:

static int
wb_write_padding_to_temp(struct archive_write *a, int64_t csize)
{
	size_t ns;
	int ret;

	ns = (size_t)(csize % LOGICAL_BLOCK_SIZE);
	if (ns != 0)
		ret = write_null(a, LOGICAL_BLOCK_SIZE - ns);
	else
		ret = ARCHIVE_OK;
	return (ret);
}